

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

bool __thiscall benchmark::anon_unknown_1::TimerManager::Barrier(TimerManager *this,MutexLock *ml)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int phase_number_cp;
  CheckHandler CStack_38;
  
  if (this->entered_ < this->num_threads_) {
    internal::GetNullLogInstance();
    iVar3 = this->entered_ + 1;
    this->entered_ = iVar3;
    iVar1 = this->num_threads_;
    iVar2 = this->phase_number_;
    if (iVar3 < iVar1) {
      do {
        std::condition_variable::wait((unique_lock *)&this->phase_condition_);
      } while (this->phase_number_ <= iVar2);
    }
    else {
      this->phase_number_ = iVar2 + 1;
      this->entered_ = 0;
    }
    return iVar1 <= iVar3;
  }
  internal::CheckHandler::CheckHandler
            (&CStack_38,"(entered_) < (num_threads_)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"Barrier",0xe6);
  internal::CheckHandler::~CheckHandler(&CStack_38);
}

Assistant:

REQUIRES(lock_) {
    CHECK_LT(entered_, num_threads_);
    entered_++;
    if (entered_ < num_threads_) {
      // Wait for all threads to enter
      int phase_number_cp = phase_number_;
      auto cb = [this, phase_number_cp]() {
        return this->phase_number_ > phase_number_cp;
      };
      phase_condition_.wait(ml.native_handle(), cb);
      return false;  // I was not the last one
    } else {
      // Last thread has reached the barrier
      phase_number_++;
      entered_ = 0;
      return true;
    }
  }